

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O2

size_t bpkiPrivkeyEnc(octet *pki,octet *privkey,size_t privkey_len)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  octet *poVar6;
  char *oid;
  octet *poVar7;
  der_anchor_t BignAlgId [1];
  der_anchor_t PKI [1];
  
  sVar1 = derTSEQEncStart(PKI,pki,0,0x30);
  poVar6 = pki + sVar1;
  if (pki == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar2 = derTSIZEEnc(poVar6,2,0);
  poVar7 = poVar6 + sVar2;
  if (poVar6 == (octet *)0x0) {
    poVar7 = (octet *)0x0;
  }
  sVar3 = derTSEQEncStart(BignAlgId,poVar7,sVar2 + sVar1,0x30);
  poVar6 = poVar7 + sVar3;
  if (poVar7 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar4 = derOIDEnc(poVar6,"1.2.112.0.2.0.34.101.45.2.1");
  if (privkey_len == 0x18) {
    oid = "1.2.112.0.2.0.34.101.45.3.0";
  }
  else if (privkey_len == 0x30) {
    oid = "1.2.112.0.2.0.34.101.45.3.2";
  }
  else if (privkey_len == 0x20) {
    oid = "1.2.112.0.2.0.34.101.45.3.1";
  }
  else {
    oid = "1.2.112.0.2.0.34.101.45.3.3";
  }
  poVar7 = poVar6 + sVar4;
  if (poVar6 == (octet *)0x0) {
    poVar7 = (octet *)0x0;
  }
  sVar5 = derOIDEnc(poVar7,oid);
  poVar6 = poVar7 + sVar5;
  if (poVar7 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar5 = sVar5 + sVar2 + sVar1 + sVar3 + sVar4;
  sVar1 = derTSEQEncStop(poVar6,sVar5,BignAlgId);
  poVar7 = poVar6 + sVar1;
  if (poVar6 == (octet *)0x0) {
    poVar7 = (octet *)0x0;
  }
  sVar2 = derEnc(poVar7,4,privkey,privkey_len);
  poVar6 = poVar7 + sVar2;
  if (poVar7 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar2 = sVar2 + sVar1 + sVar5;
  sVar1 = derTSEQEncStop(poVar6,sVar2,PKI);
  return sVar1 + sVar2;
}

Assistant:

static size_t bpkiPrivkeyEnc(octet pki[], const octet privkey[],
	size_t privkey_len)
{
	der_anchor_t PKI[1];
	der_anchor_t BignAlgId[1];
	size_t count = 0;
	// проверить ключи
	ASSERT(privkey_len == 24 || privkey_len == 32 || privkey_len == 48 || 
		privkey_len == 64);
	ASSERT(memIsNullOrValid(privkey, privkey_len));
	// кодировать
	derEncStep(derSEQEncStart(PKI, pki, count), pki, count);
	 derEncStep(derSIZEEnc(pki, 0), pki, count);
	 derEncStep(derSEQEncStart(BignAlgId, pki, count), pki, count);
	  derEncStep(derOIDEnc(pki, oid_bign_pubkey), pki, count);
	  if (privkey_len == 24)
		  derEncStep(derOIDEnc(pki, oid_bign_curve192v1), pki, count);
	  else if (privkey_len == 32)
		  derEncStep(derOIDEnc(pki, oid_bign_curve256v1), pki, count);
	  else if (privkey_len == 48)
		  derEncStep(derOIDEnc(pki, oid_bign_curve384v1), pki, count);
	  else
		  derEncStep(derOIDEnc(pki, oid_bign_curve512v1), pki, count);
	 derEncStep(derSEQEncStop(pki, count, BignAlgId), pki, count);
	 derEncStep(derOCTEnc(pki, privkey, privkey_len), pki, count);
	derEncStep(derSEQEncStop(pki, count, PKI), pki, count);
	// возвратить длину DER-кода
	return count;
}